

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_postfilter.cc
# Opt level: O0

bool __thiscall
sptk::MelCepstrumPostfilter::Run
          (MelCepstrumPostfilter *this,vector<double,_std::allocator<double>_> *mel_cepstrum,
          vector<double,_std::allocator<double>_> *postfiltered_mel_cepstrum,Buffer *buffer)

{
  pointer *ppdVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  const_iterator mlsa_digital_filter_coefficients;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> mel_cepstrum_00;
  long in_RCX;
  Buffer *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  anon_class_8_1_71f533b6 in_RDI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  double dVar6;
  double modified_energy;
  double weight;
  double original_energy;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff38;
  value_type vVar7;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *minimum_phase_sequence;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  minimum_phase_sequence = (vector<double,_std::allocator<double>_> *)in_RDI.weight;
  iVar3 = GetNumOrder((MelCepstrumPostfilter *)0x1072b9);
  iVar3 = iVar3 + 1;
  if ((((((ulong)(((vector<double,_std::allocator<double>_> *)((long)in_RDI.weight + 0xf0))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish & 1) == 0) ||
       (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar4 != (long)iVar3))
      || (in_RDX == (Buffer *)0x0)) || (in_RCX == 0)) {
    return false;
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)in_RDX);
  if (sVar4 != (long)iVar3) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50._M_current,
               (size_type)in_stack_ffffffffffffff48._M_current);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x38));
  if (sVar4 != (long)iVar3) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50._M_current,
               (size_type)in_stack_ffffffffffffff48._M_current);
  }
  ppdVar1 = &(((vector<double,_std::allocator<double>_> *)in_RDI.weight)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  if (((double)*ppdVar1 == 0.0) && (!NAN((double)*ppdVar1))) {
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    return true;
  }
  bVar2 = FrequencyTransform::Run
                    ((FrequencyTransform *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     minimum_phase_sequence,in_RSI,(Buffer *)in_RDX);
  if (!bVar2) {
    return false;
  }
  bVar2 = CepstrumToAutocorrelation::Run
                    ((CepstrumToAutocorrelation *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     minimum_phase_sequence,in_RSI,in_RDX);
  if (!bVar2) {
    return false;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
  dVar6 = *pvVar5;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
  operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
            in_stack_ffffffffffffff38._M_current,(difference_type)in_RDI.weight);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  std::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __first._M_current =
       (double *)
       ((double)(((vector<double,_std::allocator<double>_> *)in_RDI.weight)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_end_of_storage + 1.0);
  mlsa_digital_filter_coefficients =
       std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  mel_cepstrum_00 =
       __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
       operator+(in_stack_ffffffffffffff38._M_current,(difference_type)in_RDI.weight);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffff38._M_current,(difference_type)in_RDI.weight);
  std::
  transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::MelCepstrumPostfilter::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::MelCepstrumPostfilter::Buffer*)const::__0>
            (__first,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI);
  bVar2 = FrequencyTransform::Run
                    ((FrequencyTransform *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     minimum_phase_sequence,in_RSI,(Buffer *)in_RDX);
  if (!bVar2) {
    return false;
  }
  bVar2 = CepstrumToAutocorrelation::Run
                    ((CepstrumToAutocorrelation *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     minimum_phase_sequence,in_RSI,in_RDX);
  if (!bVar2) {
    return false;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
  vVar7 = *pvVar5;
  bVar2 = MelCepstrumToMlsaDigitalFilterCoefficients::Run
                    ((MelCepstrumToMlsaDigitalFilterCoefficients *)__first._M_current,
                     (vector<double,_std::allocator<double>_> *)mel_cepstrum_00._M_current,
                     (vector<double,_std::allocator<double>_> *)
                     mlsa_digital_filter_coefficients._M_current);
  if (!bVar2) {
    return false;
  }
  dVar6 = log(dVar6 / vVar7);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x50),0);
  *pvVar5 = dVar6 * 0.5 + *pvVar5;
  bVar2 = MlsaDigitalFilterCoefficientsToMelCepstrum::Run
                    ((MlsaDigitalFilterCoefficientsToMelCepstrum *)__first._M_current,
                     (vector<double,_std::allocator<double>_> *)mel_cepstrum_00._M_current,
                     (vector<double,_std::allocator<double>_> *)
                     mlsa_digital_filter_coefficients._M_current);
  if (!bVar2) {
    return false;
  }
  return true;
}

Assistant:

bool MelCepstrumPostfilter::Run(const std::vector<double>& mel_cepstrum,
                                std::vector<double>* postfiltered_mel_cepstrum,
                                MelCepstrumPostfilter::Buffer* buffer) const {
  // Check inputs.
  const int length(GetNumOrder() + 1);
  if (!is_valid_ || mel_cepstrum.size() != static_cast<std::size_t>(length) ||
      NULL == postfiltered_mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (postfiltered_mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    postfiltered_mel_cepstrum->resize(length);
  }
  if (buffer->mel_cepstrum_.size() != static_cast<std::size_t>(length)) {
    buffer->mel_cepstrum_.resize(length);
  }

  // Handle special case.
  if (0.0 == beta_) {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.end(),
              postfiltered_mel_cepstrum->begin());
    return true;
  }

  // Calculate energy of original mel-cepstrum.
  {
    if (!frequency_transform_.Run(mel_cepstrum, &buffer->cepstrum_,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
    if (!cepstrum_to_autocorrelation_.Run(
            buffer->cepstrum_, &buffer->autocorrelation_,
            &buffer->buffer_for_cepstrum_to_autocorrelation_)) {
      return false;
    }
  }
  const double original_energy(buffer->autocorrelation_[0]);

  // Calculate energy of modified mel-cepstrum.
  {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.begin() + onset_index_,
              buffer->mel_cepstrum_.begin());
    const double weight(1.0 + beta_);
    std::transform(mel_cepstrum.begin() + onset_index_, mel_cepstrum.end(),
                   buffer->mel_cepstrum_.begin() + onset_index_,
                   [weight](double c) { return c * weight; });

    if (!frequency_transform_.Run(buffer->mel_cepstrum_, &buffer->cepstrum_,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
    if (!cepstrum_to_autocorrelation_.Run(
            buffer->cepstrum_, &buffer->autocorrelation_,
            &buffer->buffer_for_cepstrum_to_autocorrelation_)) {
      return false;
    }
  }
  const double modified_energy(buffer->autocorrelation_[0]);

  // Adjust gain.
  {
    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients_.Run(
            buffer->mel_cepstrum_,
            &buffer->mlsa_digital_filter_coefficients_)) {
      return false;
    }

    buffer->mlsa_digital_filter_coefficients_[0] +=
        (0.5 * std::log(original_energy / modified_energy));

    if (!mlsa_digital_filter_coefficients_to_mel_cepstrum_.Run(
            buffer->mlsa_digital_filter_coefficients_,
            postfiltered_mel_cepstrum)) {
      return false;
    }
  }

  return true;
}